

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Getters.h
# Opt level: O1

GameState __thiscall libchess::Position::game_state(Position *this)

{
  int iVar1;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  Bitboard BVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  GameState GVar9;
  uint uVar10;
  hash_type *phVar11;
  bool bVar12;
  PieceType pt;
  ulong uVar13;
  MoveList move_list;
  MoveList local_48;
  
  iVar1 = this->ply_;
  lVar6 = (long)iVar1;
  pSVar2 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = iVar1 - pSVar2[lVar6].halfmoves_;
  iVar8 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  bVar12 = (int)uVar10 <= iVar1 + -2;
  if ((int)uVar10 <= iVar1 + -2) {
    lVar7 = lVar6 + -2;
    phVar11 = &pSVar2[lVar6 + -2].hash_;
    bVar12 = true;
    do {
      if (*phVar11 == pSVar2[lVar6].hash_) {
        if (0 < iVar8) break;
        iVar8 = iVar8 + 1;
      }
      lVar7 = lVar7 + -2;
      phVar11 = phVar11 + -0xe;
      bVar12 = (long)(ulong)uVar10 <= lVar7;
    } while ((long)(ulong)uVar10 <= lVar7);
  }
  GVar9 = THREEFOLD_REPETITION;
  if ((!bVar12) && (GVar9 = FIFTY_MOVES, pSVar2[lVar6].halfmoves_ < 100)) {
    legal_move_list(&local_48,this,(Color)(this->side_to_move_).super_MetaValueType<int>.value_);
    GVar9 = IN_PROGRESS;
    if (local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      iVar1 = (this->side_to_move_).super_MetaValueType<int>.value_;
      uVar3 = this->color_bb_[0].value_;
      uVar4 = this->piece_type_bb_[5].value_ & this->color_bb_[iVar1].value_;
      lVar6 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar4 = this->color_bb_[1].value_;
      uVar13 = (uVar3 & *(ulong *)(&DAT_00145d48 + lVar6 * 8) |
               uVar4 & (&lookups::PAWN_ATTACKS)[lVar6]) & this->piece_type_bb_[0].value_;
      lVar7 = 1;
      do {
        BVar5 = lookups::non_pawn_piece_type_attacks
                          ((MetaValueType<int>)(value_type)lVar7,
                           (MetaValueType<int>)(value_type)lVar6,(Bitboard)(uVar4 | uVar3));
        uVar13 = uVar13 | BVar5.value_ & this->piece_type_bb_[lVar7].value_;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      GVar9 = ((uVar13 & this->color_bb_[iVar1 == 0].value_) == 0) + CHECKMATE;
    }
    if (local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.values_.
                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.values_.
                            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.values_.
                            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return GVar9;
}

Assistant:

inline Position::GameState Position::game_state() const {
    if (is_repeat(2)) {
        return GameState::THREEFOLD_REPETITION;
    } else if (halfmoves() >= 100) {
        return GameState::FIFTY_MOVES;
    } else {
        MoveList move_list = legal_move_list();

        if (move_list.empty()) {
            return in_check() ? GameState::CHECKMATE : GameState::STALEMATE;
        }

        return GameState::IN_PROGRESS;
    }
}